

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void nni_http_server_stop(nni_http_server *s)

{
  nni_mtx_lock(&s->mtx);
  if (s->starts != 0) {
    s->starts = s->starts + -1;
  }
  if (s->starts == 0) {
    http_server_stop(s);
  }
  nni_mtx_unlock(&s->mtx);
  nni_aio_stop(&s->accaio);
  nng_stream_listener_stop(s->listener);
  return;
}

Assistant:

void
nni_http_server_stop(nni_http_server *s)
{
	nni_mtx_lock(&s->mtx);
	if (s->starts != 0) {
		s->starts--;
	}
	if (s->starts == 0) {
		http_server_stop(s);
	}
	nni_mtx_unlock(&s->mtx);
	nni_aio_stop(&s->accaio);
	nng_stream_listener_stop(s->listener);
}